

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O3

int64_t yactfr::internal::anon_unknown_0::readFlSIntBe43At5(uint8_t *buf)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = (ulong)((uint)buf[2] | (uint)buf[1] << 8 | (*buf & 7) << 0x10) << 0x18;
  uVar3 = (ulong)buf[5] | (ulong)((uint)buf[4] << 8 | (uint)buf[3] << 0x10) | uVar2;
  uVar1 = uVar3 | 0xfffff80000000000;
  if (uVar2 >> 0x2a == 0) {
    uVar1 = uVar3;
  }
  return uVar1;
}

Assistant:

std::int64_t readFlSIntBe43At5(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[0];
    res <<= 8;
    res |= buf[1];
    res <<= 8;
    res |= buf[2];
    res <<= 8;
    res |= buf[3];
    res <<= 8;
    res |= buf[4];
    res <<= 8;
    res |= buf[5];
    res &= UINT64_C(0x7ffffffffff);

    if (res >> 42) {
        res |= UINT64_C(0xfffff80000000000);
    }

    return static_cast<std::int64_t>(res);
}